

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_rasterizer_sl_clip.h
# Opt level: O2

void __thiscall
agg::rasterizer_sl_clip<agg::ras_conv_int>::line_to<agg::rasterizer_cells_aa<agg::cell_aa>>
          (rasterizer_sl_clip<agg::ras_conv_int> *this,rasterizer_cells_aa<agg::cell_aa> *ras,
          coord_type x2,coord_type y2)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  uint f2;
  int y1;
  coord_type x1;
  uint uVar4;
  uint uVar5;
  int iVar6;
  coord_type cVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  coord_type cVar14;
  int iVar17;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  uint f1;
  
  if (this->m_clipping != true) {
    rasterizer_cells_aa<agg::cell_aa>::line(ras,this->m_x1,this->m_y1,x2,y2);
    goto LAB_0010e778;
  }
  f2 = clipping_flags<int>(x2,y2,&this->m_clip_box);
  f1 = this->m_f1;
  if ((f1 & 10) == (f2 & 10) && (f1 & 10) != 0) {
    this->m_x1 = x2;
    this->m_y1 = y2;
    this->m_f1 = f2;
    return;
  }
  uVar4 = (f2 & 5) + (f1 & 5) * 2;
  if (0xc < uVar4) goto switchD_0010e2e3_caseD_5;
  x1 = this->m_x1;
  y1 = this->m_y1;
  cVar7 = x2;
  switch(uVar4) {
  case 0:
    break;
  case 1:
    iVar6 = (this->m_clip_box).x2;
    dVar12 = ((double)(y2 - y1) * (double)(iVar6 - x1)) / (double)(x2 - x1);
    cVar14 = (int)(dVar12 + *(double *)(&DAT_00118990 + (ulong)(dVar12 < 0.0) * 8)) + y1;
    uVar4 = (uint)((this->m_clip_box).y2 < cVar14) * 2 + (uint)(cVar14 < (this->m_clip_box).y1) * 8;
    goto LAB_0010e6b1;
  case 2:
    iVar6 = (this->m_clip_box).x2;
    dVar12 = ((double)(y2 - y1) * (double)(iVar6 - x1)) / (double)(x2 - x1);
    iVar8 = (int)(dVar12 + *(double *)(&DAT_00118990 + (ulong)(dVar12 < 0.0) * 8)) + y1;
    uVar4 = (uint)((this->m_clip_box).y2 < iVar8) * 2 + (uint)(iVar8 < (this->m_clip_box).y1) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar6,y1,iVar6,iVar8,f1,uVar4);
    x1 = (this->m_clip_box).x2;
    y1 = iVar8;
    f1 = uVar4;
    break;
  case 3:
    x1 = (this->m_clip_box).x2;
    cVar7 = x1;
    break;
  case 4:
    iVar6 = (this->m_clip_box).x1;
    dVar12 = ((double)(y2 - y1) * (double)(iVar6 - x1)) / (double)(x2 - x1);
    cVar14 = (int)(dVar12 + *(double *)(&DAT_00118990 + (ulong)(dVar12 < 0.0) * 8)) + y1;
    uVar4 = (uint)((this->m_clip_box).y2 < cVar14) * 2 + (uint)(cVar14 < (this->m_clip_box).y1) * 8;
    goto LAB_0010e73a;
  default:
    goto switchD_0010e2e3_caseD_5;
  case 6:
    cVar7 = (this->m_clip_box).x2;
    dVar12 = (double)(x2 - x1);
    uVar1 = (this->m_clip_box).x1;
    auVar18._0_8_ = (double)(y2 - y1) * (double)(uVar1 - x1);
    auVar18._8_8_ = (double)(y2 - y1) * (double)(cVar7 - x1);
    auVar9._8_8_ = dVar12;
    auVar9._0_8_ = dVar12;
    auVar19 = divpd(auVar18,auVar9);
    auVar10._8_8_ = -(ulong)(auVar19._8_8_ < 0.0);
    auVar10._0_8_ = -(ulong)(auVar19._0_8_ < 0.0);
    auVar13 = blendvpd(_DAT_00118950,_DAT_00118960,auVar10);
    iVar8 = (this->m_clip_box).y2;
    iVar2 = this->m_x1;
    iVar6 = (this->m_clip_box).y1;
    cVar14 = y1 + (int)(auVar13._0_8_ + auVar19._0_8_);
    iVar17 = y1 + (int)(auVar13._8_8_ + auVar19._8_8_);
    auVar11._4_4_ = iVar8;
    auVar11._0_4_ = iVar8;
    auVar11._8_4_ = iVar2;
    auVar11._12_4_ = iVar2;
    auVar15._0_4_ = -(uint)(iVar8 < cVar14);
    auVar15._4_4_ = -(uint)(iVar8 < iVar17);
    auVar15._8_4_ = -(uint)(iVar2 < 0);
    auVar15._12_4_ = -(uint)(iVar2 < 0);
    auVar13 = pmovsxdq(auVar11,auVar15);
    uVar4 = movmskpd(x2 - x1,auVar13);
    uVar5 = (uVar4 & 0xfffffffe) + (uint)(iVar17 < iVar6) * 8;
    uVar4 = (uVar4 & 1) * 2 + (uint)(cVar14 < iVar6) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,cVar7,y1,cVar7,iVar17,f1,uVar5);
    iVar6 = (this->m_clip_box).x1;
    x1 = (this->m_clip_box).x2;
    y1 = iVar17;
    f1 = uVar5;
LAB_0010e73a:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,iVar6,cVar14,f1,uVar4);
    x1 = (this->m_clip_box).x1;
    y1 = cVar14;
    cVar7 = x1;
    f1 = uVar4;
    break;
  case 8:
    iVar6 = (this->m_clip_box).x1;
    dVar12 = ((double)(y2 - y1) * (double)(iVar6 - x1)) / (double)(x2 - x1);
    iVar8 = (int)(dVar12 + *(double *)(&DAT_00118990 + (ulong)(dVar12 < 0.0) * 8)) + y1;
    uVar4 = (uint)((this->m_clip_box).y2 < iVar8) * 2 + (uint)(iVar8 < (this->m_clip_box).y1) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,iVar6,y1,iVar6,iVar8,f1,uVar4);
    x1 = (this->m_clip_box).x1;
    y1 = iVar8;
    f1 = uVar4;
    break;
  case 9:
    dVar12 = (double)(x2 - x1);
    uVar3 = (this->m_clip_box).x2;
    cVar7 = (this->m_clip_box).x1;
    auVar20._0_8_ = (double)(y2 - y1) * (double)(uVar3 - x1);
    auVar20._8_8_ = (double)(y2 - y1) * (double)(cVar7 - x1);
    auVar13._8_8_ = dVar12;
    auVar13._0_8_ = dVar12;
    auVar21 = divpd(auVar20,auVar13);
    auVar19._8_8_ = -(ulong)(auVar21._8_8_ < 0.0);
    auVar19._0_8_ = -(ulong)(auVar21._0_8_ < 0.0);
    auVar13 = blendvpd(_DAT_00118950,_DAT_00118960,auVar19);
    iVar6 = (this->m_clip_box).y1;
    iVar8 = (this->m_clip_box).y2;
    iVar2 = this->m_x1;
    cVar14 = y1 + (int)(auVar13._0_8_ + auVar21._0_8_);
    iVar17 = y1 + (int)(auVar13._8_8_ + auVar21._8_8_);
    auVar21._4_4_ = iVar8;
    auVar21._0_4_ = iVar8;
    auVar21._8_4_ = iVar2;
    auVar21._12_4_ = iVar2;
    auVar16._0_4_ = -(uint)(iVar8 < cVar14);
    auVar16._4_4_ = -(uint)(iVar8 < iVar17);
    auVar16._8_4_ = -(uint)(iVar2 < 0);
    auVar16._12_4_ = -(uint)(iVar2 < 0);
    auVar13 = pmovsxdq(auVar21,auVar16);
    uVar4 = movmskpd(x2 - x1,auVar13);
    uVar5 = (uVar4 & 0xfffffffe) + (uint)(iVar17 < iVar6) * 8;
    uVar4 = (uVar4 & 1) * 2 + (uint)(cVar14 < iVar6) * 8;
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,cVar7,y1,cVar7,iVar17,f1,uVar5);
    x1 = (this->m_clip_box).x1;
    iVar6 = (this->m_clip_box).x2;
    y1 = iVar17;
    f1 = uVar5;
LAB_0010e6b1:
    line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,iVar6,cVar14,f1,uVar4);
    x1 = (this->m_clip_box).x2;
    y1 = cVar14;
    cVar7 = x1;
    f1 = uVar4;
    break;
  case 0xc:
    x1 = (this->m_clip_box).x1;
    cVar7 = x1;
  }
  line_clip_y<agg::rasterizer_cells_aa<agg::cell_aa>>(this,ras,x1,y1,cVar7,y2,f1,f2);
switchD_0010e2e3_caseD_5:
  this->m_f1 = f2;
LAB_0010e778:
  this->m_x1 = x2;
  this->m_y1 = y2;
  return;
}

Assistant:

void line_to(Rasterizer& ras, coord_type x2, coord_type y2)
        {
            if(m_clipping)
            {
                unsigned f2 = clipping_flags(x2, y2, m_clip_box);

                if((m_f1 & 10) == (f2 & 10) && (m_f1 & 10) != 0)
                {
                    // Invisible by Y
                    m_x1 = x2;
                    m_y1 = y2;
                    m_f1 = f2;
                    return;
                }

                coord_type x1 = m_x1;
                coord_type y1 = m_y1;
                unsigned   f1 = m_f1;
                coord_type y3, y4;
                unsigned   f3, f4;

                switch(((f1 & 5) << 1) | (f2 & 5))
                {
                case 0: // Visible by X
                    line_clip_y(ras, x1, y1, x2, y2, f1, f2);
                    break;

                case 1: // x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x2, y2, f3, f2);
                    break;

                case 2: // x1 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, x2, y2, f3, f2);
                    break;

                case 3: // x1 > clip.x2 && x2 > clip.x2
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y2, f1, f2);
                    break;

                case 4: // x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x1, y2, f3, f2);
                    break;

                case 6: // x1 > clip.x2 && x2 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x2, y1, m_clip_box.x2, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x2, y3, m_clip_box.x1, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x1, y4, m_clip_box.x1, y2, f4, f2);
                    break;

                case 8: // x1 < clip.x1
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, x2, y2, f3, f2);
                    break;

                case 9:  // x1 < clip.x1 && x2 > clip.x2
                    y3 = y1 + Conv::mul_div(m_clip_box.x1-x1, y2-y1, x2-x1);
                    y4 = y1 + Conv::mul_div(m_clip_box.x2-x1, y2-y1, x2-x1);
                    f3 = clipping_flags_y(y3, m_clip_box);
                    f4 = clipping_flags_y(y4, m_clip_box);
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y3, f1, f3);
                    line_clip_y(ras, m_clip_box.x1, y3, m_clip_box.x2, y4, f3, f4);
                    line_clip_y(ras, m_clip_box.x2, y4, m_clip_box.x2, y2, f4, f2);
                    break;

                case 12: // x1 < clip.x1 && x2 < clip.x1
                    line_clip_y(ras, m_clip_box.x1, y1, m_clip_box.x1, y2, f1, f2);
                    break;
                }
                m_f1 = f2;
            }
            else
            {
                ras.line(Conv::xi(m_x1), Conv::yi(m_y1), 
                         Conv::xi(x2),   Conv::yi(y2)); 
            }
            m_x1 = x2;
            m_y1 = y2;
        }